

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_unsigned.cpp
# Opt level: O0

sc_unsigned * __thiscall sc_dt::sc_unsigned::operator=(sc_unsigned *this,long v)

{
  small_type sVar1;
  sc_unsigned *in_RSI;
  sc_unsigned *in_RDI;
  int unaff_retaddr;
  sc_unsigned *u;
  
  u = in_RDI;
  sVar1 = get_sign<long>((long *)in_RDI);
  in_RDI->sgn = sVar1;
  if (in_RDI->sgn == 0) {
    vec_zero((int)((ulong)in_RSI >> 0x20),(sc_digit *)in_RDI);
  }
  else {
    from_uint<unsigned_long>(unaff_retaddr,(sc_digit *)u,(unsigned_long)in_RSI);
    convert_SM_to_2C_to_SM(in_RSI);
  }
  return in_RDI;
}

Assistant:

const sc_unsigned&
sc_unsigned::operator=(long v)
{
  sgn = get_sign(v);
  if ( sgn == SC_ZERO ) {
    vec_zero(ndigits, digit);
  }
  else {
    from_uint(ndigits, digit, (unsigned long) v);
    convert_SM_to_2C_to_SM();
  }
  return *this;
}